

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int parse_ignore(char *data,char *endstr,uint *len)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  char *local_38;
  char *c;
  uint slen;
  uint *len_local;
  char *endstr_local;
  char *data_local;
  
  sVar3 = strlen(endstr);
  local_38 = data;
  while( true ) {
    bVar4 = false;
    if (*local_38 != '\0') {
      iVar2 = strncmp(local_38,endstr,sVar3 & 0xffffffff);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_38 = local_38 + 1;
  }
  cVar1 = *local_38;
  if (cVar1 != '\0') {
    *len = ((int)local_38 + (int)sVar3) - (int)data;
  }
  else {
    ly_vlog(LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"closing sequence",endstr);
  }
  data_local._4_4_ = (uint)(cVar1 == '\0');
  return data_local._4_4_;
}

Assistant:

static int
parse_ignore(const char *data, const char *endstr, unsigned int *len)
{
    unsigned int slen;
    const char *c = data;

    slen = strlen(endstr);

    while (*c && strncmp(c, endstr, slen)) {
        c++;
    }
    if (!*c) {
        LOGVAL(LYE_XML_MISS, LY_VLOG_NONE, NULL, "closing sequence", endstr);
        return EXIT_FAILURE;
    }
    c += slen;

    *len = c - data;
    return EXIT_SUCCESS;
}